

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_ogf.cxx
# Opt level: O3

bool __thiscall xray_re::xr_ogf::load_ogf(xr_ogf *this,char *path,string *name)

{
  int iVar1;
  xr_reader *pxVar2;
  
  if (xr_file_system::instance()::instance0 == '\0') {
    iVar1 = __cxa_guard_acquire(&xr_file_system::instance()::instance0);
    if (iVar1 != 0) {
      xr_file_system::xr_file_system(&xr_file_system::instance::instance0);
      __cxa_atexit(xr_file_system::~xr_file_system,&xr_file_system::instance::instance0,
                   &__dso_handle);
      __cxa_guard_release(&xr_file_system::instance()::instance0);
    }
  }
  pxVar2 = xr_file_system::r_open
                     (&xr_file_system::instance::instance0,path,(name->_M_dataplus)._M_p);
  if (pxVar2 != (xr_reader *)0x0) {
    (*(this->super_xr_object).super_xr_surface_factory._vptr_xr_surface_factory[0x15])(this,pxVar2);
    (*pxVar2->_vptr_xr_reader[1])(pxVar2);
  }
  return pxVar2 != (xr_reader *)0x0;
}

Assistant:

bool xr_ogf::load_ogf(const char* path, const std::string& name)
{
	xr_file_system& fs = xr_file_system::instance();
	xr_reader* r = fs.r_open(path, name);
	if (r == 0)
		return false;
	load_ogf(*r);
	fs.r_close(r);
	return true;
}